

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmGen9TextureCalc::Fill1DTexOffsetAddress
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  ulong uVar1;
  GMM_GFX_SIZE_T GVar2;
  uint MipLevel;
  
  uVar1 = (ulong)(pTexInfo->BitsPerPixel * (pTexInfo->Alignment).QPitch >> 3);
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = uVar1;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = uVar1;
  MipLevel = 0;
  do {
    GVar2 = Get1DTexOffsetAddressPerMip(this,pTexInfo,MipLevel);
    *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)MipLevel * 8 + 0x80) = GVar2;
    MipLevel = MipLevel + 1;
  } while (MipLevel <= pTexInfo->MaxLod);
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::Fill1DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    GMM_DPF_ENTER;

    pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
    pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock =
    pTexInfo->Alignment.QPitch * pTexInfo->BitsPerPixel >> 3;

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get1DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}